

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c++
# Opt level: O3

void * kj::Thread::runThread(void *ptr)

{
  long *plVar1;
  undefined8 *puVar2;
  
  puVar2 = *ptr;
  plVar1 = *(long **)((long)ptr + 8);
  *(undefined8 *)((long)ptr + 8) = 0;
  (**(code **)**(undefined8 **)((long)ptr + 0x18))();
  if (plVar1 != (long *)0x0) {
    (**(code **)*puVar2)(puVar2,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  ThreadState::unref((ThreadState *)ptr);
  return (void *)0x0;
}

Assistant:

void* Thread::runThread(void* ptr) {
#endif
  ThreadState* state = reinterpret_cast<ThreadState*>(ptr);
  KJ_IF_SOME(exception, kj::runCatchingExceptions([&]() {
    state->initializer(kj::mv(state->func));
  })) {
    state->exception = kj::mv(exception);
  }
  state->unref();
  return 0;
}